

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::HeapThunk::HeapThunk
          (HeapThunk *this,Identifier *name,HeapObject *self,uint offset,AST *body)

{
  _Rb_tree_header *p_Var1;
  
  *(undefined2 *)&(this->super_HeapEntity).type = 0;
  (this->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0028a688;
  this->name = name;
  p_Var1 = &(this->upValues)._M_t._M_impl.super__Rb_tree_header;
  (this->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->self = self;
  this->offset = offset;
  this->body = body;
  return;
}

Assistant:

HeapEntity(Type type_) : type(type_) {}